

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

int SDL_CDPlay(SDL12_CD *cdrom,int start,int length)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int ntracks;
  long lVar4;
  uint uVar5;
  Uint32 *pUVar6;
  int start_frame;
  uint start_track;
  uint uVar7;
  char *pcVar8;
  
  if (CDRomInit == '\x01') {
    if ((cdrom == (SDL12_CD *)0x0) && (cdrom = CDRomDevice, CDRomDevice == (SDL12_CD *)0x0)) {
      pcVar8 = "CD-ROM not opened";
      goto LAB_001126e2;
    }
  }
  else {
    pcVar8 = "CD-ROM subsystem not initialized";
LAB_001126e2:
    cdrom = (SDL12_CD *)0x0;
    (*SDL20_SetError)(pcVar8);
  }
  if (cdrom == (SDL12_CD *)0x0) {
    return -1;
  }
  if (cdrom->status == SDL12_CD_TRAYEMPTY) {
    pcVar8 = "Tray empty";
  }
  else {
    if (-1 < start) {
      if (length < 0) {
        pcVar8 = "Invalid length";
        goto LAB_00112792;
      }
      iVar1 = cdrom->numtracks;
      lVar2 = (long)iVar1;
      start_track = 0xffffffff;
      if (0 < lVar2) {
        pUVar6 = &cdrom->track[0].offset;
        lVar4 = 0;
        do {
          if ((*pUVar6 <= (uint)start) && ((uint)start < *pUVar6 + pUVar6[-1])) {
            start_track = (uint)lVar4;
            break;
          }
          lVar4 = lVar4 + 1;
          pUVar6 = pUVar6 + 3;
        } while (lVar2 != lVar4);
      }
      if (start_track != 0xffffffff) {
        start_frame = start - cdrom->track[(int)start_track].offset;
        uVar3 = cdrom->track[(int)start_track].length - start_frame;
        uVar5 = 0;
        uVar7 = length - uVar3;
        if ((uint)length < uVar3) {
          ntracks = 0;
          uVar5 = 0;
        }
        else {
          if ((int)(start_track + 1) < iVar1) {
            pUVar6 = &cdrom->track[(long)(int)start_track + 1].length;
            ntracks = 1;
            length = uVar7;
            do {
              uVar7 = length - *pUVar6;
              if ((uint)length < *pUVar6) goto LAB_001127e6;
              ntracks = ntracks + 1;
              pUVar6 = pUVar6 + 3;
              length = uVar7;
            } while (iVar1 - start_track != ntracks);
          }
          length = 0xffffffff;
          ntracks = -1;
          uVar5 = uVar7;
        }
LAB_001127e6:
        if (uVar5 != 0) {
          ntracks = ~start_track + iVar1;
          length = cdrom->track[lVar2 + -1].length;
        }
        iVar1 = StartCDAudioPlaying(cdrom,start_track,start_frame,ntracks,length);
        return iVar1;
      }
    }
    pcVar8 = "Invalid start";
  }
LAB_00112792:
  iVar1 = (*SDL20_SetError)(pcVar8);
  return iVar1;
}

Assistant:

SDLCALL
SDL_CDPlay(SDL12_CD *cdrom, int start, int length)
{
    const Uint32 ui32start = (Uint32) start;
    Uint32 remain = (Uint32) length;
    int start_track = -1;
    int start_frame = -1;
    int ntracks = -1;
    int nframes = -1;
    int i;

    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }
    if (start < 0) {
        return SDL20_SetError("Invalid start");
    }
    if (length < 0) {
        return SDL20_SetError("Invalid length");
    }

    for (i = 0; i < cdrom->numtracks; i++) {
        if ((ui32start >= cdrom->track[i].offset) && (ui32start < (cdrom->track[i].offset + cdrom->track[i].length))) {
            start_track = i;
            break;
        }
    }

    if (start_track == -1) {
        return SDL20_SetError("Invalid start");
    }

    start_frame = start - cdrom->track[start_track].offset;

    if (remain < (cdrom->track[start_track].length - start_frame)) {
        ntracks = 0;
        nframes = remain;
        remain = 0;
    } else {
        remain -= (cdrom->track[start_track].length - start_frame);
        for (i = start_track + 1; i < cdrom->numtracks; i++) {
            if (remain < cdrom->track[i].length) {
                ntracks = i - start_track;
                nframes = remain;
                remain = 0;
                break;
            }
            remain -= cdrom->track[i].length;
        }
    }

    if (remain) {
        ntracks = (cdrom->numtracks - start_track) - 1;
        nframes = cdrom->track[cdrom->numtracks - 1].length;
    }

    return StartCDAudioPlaying(cdrom, start_track, start_frame, ntracks, nframes);
}